

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicLattice.cpp
# Opt level: O0

void __thiscall
OpenMD::CubicLattice::setLatticeConstant
          (CubicLattice *this,vector<double,_std::allocator<double>_> *lc)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  void *this_00;
  const_reference pvVar5;
  double *pdVar6;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffe0);
  if (!bVar2) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (1 < sVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "CubicLattice::setLatticeConstant Warning: the size of lattice constant vector  is "
                              );
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      this_00 = (void *)std::ostream::operator<<(poVar4,sVar3);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    in_RDI[0xe] = (long)*pvVar5;
    dVar1 = (double)in_RDI[0xe];
    pdVar6 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0xb),0);
    *pdVar6 = dVar1;
    dVar1 = (double)in_RDI[0xe];
    pdVar6 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0xb),1);
    *pdVar6 = dVar1;
    dVar1 = (double)in_RDI[0xe];
    pdVar6 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0xb),2);
    *pdVar6 = dVar1;
    (**(code **)(*in_RDI + 0x20))();
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "CubicLattice::setLatticeConstant Error: the lattice constant vector is empty"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void CubicLattice::setLatticeConstant(const std::vector<RealType>& lc) {
    if (lc.empty()) {
      std::cerr
          << "CubicLattice::setLatticeConstant Error: the lattice constant "
             "vector is empty"
          << std::endl;
      exit(1);
    } else if (lc.size() > 1) {
      std::cerr << "CubicLattice::setLatticeConstant Warning: the size of "
                   "lattice constant "
                   "vector  is "
                << lc.size() << std::endl;
    }

    latticeParam = lc[0];

    cellLen[0] = latticeParam;
    cellLen[1] = latticeParam;
    cellLen[2] = latticeParam;

    update();
  }